

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O3

void Abc_NtkShow(Abc_Ntk_t *pNtk0,int fGateNames,int fSeq,int fUseReverse)

{
  void *pvVar1;
  int iVar2;
  FILE *__stream;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  char FileNameDot [200];
  char local_f8 [200];
  
  if (pNtk0->ntkType != ABC_NTK_LOGIC) {
    if (pNtk0->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk0) || Abc_NtkIsLogic(pNtk0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcShow.c"
                    ,0x111,"void Abc_NtkShow(Abc_Ntk_t *, int, int, int)");
    }
    iVar2 = Abc_NtkGetChoiceNum(pNtk0);
    if (iVar2 != 0) {
      puts("Temporarily visualization of AIGs with choice nodes is disabled.");
      return;
    }
  }
  Abc_ShowGetFileName(pNtk0->pName,local_f8);
  __stream = fopen(local_f8,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",local_f8);
  }
  else {
    fclose(__stream);
    pNtk = Abc_NtkDup(pNtk0);
    if ((pNtk->ntkType == ABC_NTK_LOGIC) && (pNtk->ntkFunc != ABC_FUNC_MAP)) {
      Abc_NtkToSop(pNtk,-1,1000000000);
    }
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar3 = (void **)malloc(800);
    vNodes->pArray = ppvVar3;
    pVVar4 = pNtk->vObjs;
    if (0 < pVVar4->nSize) {
      iVar2 = 0;
      uVar8 = 100;
      lVar6 = 0;
      do {
        pvVar1 = pVVar4->pArray[lVar6];
        if (pvVar1 != (void *)0x0) {
          iVar7 = (int)uVar8;
          if (iVar2 == iVar7) {
            if (iVar7 < 0x10) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
              }
              vNodes->pArray = ppvVar3;
              vNodes->nCap = 0x10;
              uVar8 = 0x10;
            }
            else {
              uVar8 = (ulong)(uint)(iVar7 * 2);
              if (vNodes->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(uVar8 * 8);
              }
              else {
                ppvVar3 = (void **)realloc(vNodes->pArray,uVar8 * 8);
              }
              vNodes->pArray = ppvVar3;
              vNodes->nCap = iVar7 * 2;
            }
          }
          else {
            ppvVar3 = vNodes->pArray;
          }
          lVar5 = (long)iVar2;
          iVar2 = iVar2 + 1;
          vNodes->nSize = iVar2;
          ppvVar3[lVar5] = pvVar1;
          pVVar4 = pNtk->vObjs;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
    }
    iVar2 = pNtk->nBarBufs;
    pNtk->nBarBufs = 0;
    if (fSeq == 0) {
      Io_WriteDotNtk(pNtk,vNodes,(Vec_Ptr_t *)0x0,local_f8,fGateNames,fUseReverse);
    }
    else {
      Io_WriteDotSeq(pNtk,vNodes,(Vec_Ptr_t *)0x0,local_f8,fGateNames,fUseReverse);
    }
    pNtk->nBarBufs = iVar2;
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
    }
    free(vNodes);
    Abc_ShowFile(local_f8);
    Abc_NtkDelete(pNtk);
  }
  return;
}

Assistant:

void Abc_NtkShow( Abc_Ntk_t * pNtk0, int fGateNames, int fSeq, int fUseReverse )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int nBarBufs;
    char FileNameDot[200];
    int i;

    assert( Abc_NtkIsStrash(pNtk0) || Abc_NtkIsLogic(pNtk0) );
    if ( Abc_NtkIsStrash(pNtk0) && Abc_NtkGetChoiceNum(pNtk0) )
    {
        printf( "Temporarily visualization of AIGs with choice nodes is disabled.\n" );
        return;
    }
    // create the file name
    Abc_ShowGetFileName( pNtk0->pName, FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );


    // convert to logic SOP
    pNtk = Abc_NtkDup( pNtk0 );
    if ( Abc_NtkIsLogic(pNtk) && !Abc_NtkHasMapping(pNtk) )
        Abc_NtkToSop( pNtk, -1, ABC_INFINITY );

    // collect all nodes in the network
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_PtrPush( vNodes, pNode );
    // write the DOT file
    nBarBufs = pNtk->nBarBufs;
    pNtk->nBarBufs = 0;
    if ( fSeq )
        Io_WriteDotSeq( pNtk, vNodes, NULL, FileNameDot, fGateNames, fUseReverse );
    else
        Io_WriteDotNtk( pNtk, vNodes, NULL, FileNameDot, fGateNames, fUseReverse );
    pNtk->nBarBufs = nBarBufs;
    Vec_PtrFree( vNodes );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
    Abc_NtkDelete( pNtk );
}